

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circularBuffer.c
# Opt level: O2

int circ_buf_write(Solution *val)

{
  Buffer *pBVar1;
  int iVar2;
  int *piVar3;
  long lVar4;
  Solution *pSVar5;
  byte bVar6;
  
  bVar6 = 0;
  iVar2 = sem_wait((sem_t *)free_sem);
  if ((iVar2 != 0) || (iVar2 = sem_wait((sem_t *)write_sem), pBVar1 = buf, iVar2 != 0)) {
    piVar3 = __errno_location();
    return (uint)(*piVar3 == 4) * 2 + -1;
  }
  pSVar5 = buf->values + buf->writePosition;
  for (lVar4 = 0x11; lVar4 != 0; lVar4 = lVar4 + -1) {
    pSVar5->edges[0].start = val->edges[0].start;
    val = (Solution *)((long)val + (ulong)bVar6 * -8 + 4);
    pSVar5 = (Solution *)((long)pSVar5 + ((ulong)bVar6 * -2 + 1) * 4);
  }
  pBVar1->writePosition = (pBVar1->writePosition + 1) % 5;
  iVar2 = sem_post((sem_t *)write_sem);
  if (iVar2 != 0) {
    return -1;
  }
  iVar2 = sem_post((sem_t *)used_sem);
  return -(uint)(iVar2 != 0);
}

Assistant:

int circ_buf_write(const Solution *val)
{

    if (sem_wait(free_sem) != 0)
    { 
        if(errno==EINTR)
            return 1;
        else
            return -1;
    }

    if (sem_wait(write_sem) != 0)
    {
        if(errno==EINTR)
            return 1;
        else
            return -1;
    }

    buf->values[buf->writePosition] = *val;
    buf->writePosition = (buf->writePosition + 1) % BUFFERLENGTH;

    if (sem_post(write_sem) != 0)
    {
        return -1;
    }

    if (sem_post(used_sem) != 0)
    {
        return -1;
    }
    return 0;
}